

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenerator::Run(cmQtAutoGenerator *this,string *infoFile,string *config)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  allocator<char> local_a29;
  __single_object makefile;
  cmStateDirectory local_a20;
  cmStateSnapshot snapshot;
  string local_9e0;
  cmake cm;
  string msg;
  
  psVar1 = &this->InfoFile_;
  std::__cxx11::string::_M_assign((string *)psVar1);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar1);
  bVar2 = cmFileTime::Load(&this->InfoFileTime_,psVar1);
  if (bVar2) {
    cmsys::SystemTools::GetFilenamePath(&msg,infoFile);
    psVar1 = &this->InfoDir_;
    std::__cxx11::string::operator=((string *)psVar1,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::_M_assign((string *)&this->InfoConfig_);
    cmake::cmake(&cm,RoleScript,Unknown);
    cmake::SetHomeOutputDirectory(&cm,psVar1);
    cmake::SetHomeDirectory(&cm,psVar1);
    msg.field_2._M_allocated_capacity = cm.CurrentSnapshot.Position.Position;
    msg._M_dataplus._M_p = (pointer)cm.CurrentSnapshot.State;
    msg._M_string_length = (size_type)cm.CurrentSnapshot.Position.Tree;
    cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&msg);
    cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&msg,&cm);
    snapshot.Position.Position = cm.CurrentSnapshot.Position.Position;
    snapshot.State = cm.CurrentSnapshot.State;
    snapshot.Position.Tree = cm.CurrentSnapshot.Position.Tree;
    cmStateSnapshot::GetDirectory(&local_a20,&snapshot);
    cmStateDirectory::SetCurrentBinary(&local_a20,psVar1);
    cmStateSnapshot::GetDirectory(&local_a20,&snapshot);
    cmStateDirectory::SetCurrentSource(&local_a20,psVar1);
    local_a20.DirectoryState.Tree =
         (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)&msg;
    std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
              ((cmGlobalGenerator **)&makefile,(cmStateSnapshot *)&local_a20);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a20,"3.9",&local_a29);
    local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
    local_9e0._M_string_length = 0;
    local_9e0.field_2._M_local_buf[0] = '\0';
    cmMakefile::SetPolicyVersion
              ((cmMakefile *)
               makefile._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
               _M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
               super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(string *)&local_a20,
               &local_9e0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::__cxx11::string::~string((string *)&local_a20);
    iVar3 = (*this->_vptr_cmQtAutoGenerator[2])(this);
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&makefile);
    cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&msg);
    cmake::~cmake(&cm);
    if ((char)iVar3 != '\0') {
      iVar3 = (*this->_vptr_cmQtAutoGenerator[3])(this);
      return (bool)(char)iVar3;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"AutoGen: The info file ",(allocator<char> *)&cm);
    cmQtAutoGen::Quoted((string *)&cm,psVar1);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&cm);
    std::__cxx11::string::append((char *)&msg);
    cmSystemTools::Stderr(&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  return false;
}

Assistant:

bool cmQtAutoGenerator::Run(std::string const& infoFile,
                            std::string const& config)
{
  // Info settings
  InfoFile_ = infoFile;
  cmSystemTools::ConvertToUnixSlashes(InfoFile_);
  if (!InfoFileTime_.Load(InfoFile_)) {
    std::string msg = "AutoGen: The info file ";
    msg += Quoted(InfoFile_);
    msg += " is not readable\n";
    cmSystemTools::Stderr(msg);
    return false;
  }
  InfoDir_ = cmSystemTools::GetFilenamePath(infoFile);
  InfoConfig_ = config;

  bool success = false;
  {
    cmake cm(cmake::RoleScript, cmState::Unknown);
    cm.SetHomeOutputDirectory(InfoDir());
    cm.SetHomeDirectory(InfoDir());
    cm.GetCurrentSnapshot().SetDefaultDefinitions();
    cmGlobalGenerator gg(&cm);

    cmStateSnapshot snapshot = cm.GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(InfoDir());
    snapshot.GetDirectory().SetCurrentSource(InfoDir());

    auto makefile = cm::make_unique<cmMakefile>(&gg, snapshot);
    // The OLD/WARN behavior for policy CMP0053 caused a speed regression.
    // https://gitlab.kitware.com/cmake/cmake/issues/17570
    makefile->SetPolicyVersion("3.9", std::string());
    gg.SetCurrentMakefile(makefile.get());
    success = this->Init(makefile.get());
  }
  if (success) {
    success = this->Process();
  }
  return success;
}